

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<void_(HighFreqDataType::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::python::default_call_policies,_boost::mpl::vector3<void,_HighFreqDataType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
::operator()(impl<void_(HighFreqDataType::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::python::default_call_policies,_boost::mpl::vector3<void,_HighFreqDataType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  c_t0 c0;
  c_t1 c1;
  arg_lvalue_from_python_base local_68;
  undefined4 local_5c;
  arg_rvalue_from_python<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  converter::reference_arg_from_python<HighFreqDataType_&>::reference_arg_from_python
            ((reference_arg_from_python<HighFreqDataType_&> *)&local_68,(PyObject *)args_[1].ob_type
            );
  if (local_68.m_result == (void *)0x0) {
    pPVar1 = (PyObject *)0x0;
  }
  else {
    converter::
    arg_rvalue_from_python<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::arg_rvalue_from_python(&local_58,(PyObject *)args_[2].ob_refcnt);
    if (local_58.m_data.
        super_rvalue_from_python_storage<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .stage1.convertible == (void *)0x0) {
      pPVar1 = (PyObject *)0x0;
    }
    else {
      local_5c = 0;
      pPVar1 = invoke<int,void(HighFreqDataType::*)(std::__cxx11::string_const&),boost::python::arg_from_python<HighFreqDataType&>,boost::python::arg_from_python<std::__cxx11::string_const&>>
                         (&local_5c,this,&local_68,&local_58);
    }
    converter::
    rvalue_from_python_data<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~rvalue_from_python_data(&local_58.m_data);
  }
  return pPVar1;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }